

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>
::fastAccessDx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>_>,_Fad<double>_>
               *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int iVar5;
  FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_> *pFVar6
  ;
  FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_> *pFVar7;
  FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_> *pFVar8;
  value_type vVar9;
  double dVar10;
  
  vVar9 = FadBinaryMul<FadExpr<FadBinaryDiv<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadFuncSqrt<FadExpr<FadBinaryDiv<Fad<double>,_FadCst<double>_>_>_>_>_>
          ::fastAccessDx(&this->left_->fadexpr_,i);
  dVar1 = this->right_->val_;
  dVar2 = (this->right_->dx_).ptr_to_data[i];
  pFVar6 = (this->left_->fadexpr_).left_;
  pFVar7 = (this->left_->fadexpr_).right_;
  iVar5 = (pFVar6->fadexpr_).left_.constant_;
  pFVar8 = (pFVar6->fadexpr_).right_;
  dVar3 = (pFVar8->fadexpr_).left_.constant_;
  dVar4 = ((pFVar8->fadexpr_).right_)->val_;
  dVar10 = ((pFVar7->fadexpr_).expr_.fadexpr_.left_)->val_ /
           (pFVar7->fadexpr_).expr_.fadexpr_.right_.constant_;
  if (dVar10 < 0.0) {
    dVar10 = sqrt(dVar10);
  }
  else {
    dVar10 = SQRT(dVar10);
  }
  return vVar9 * dVar1 + dVar2 * ((double)iVar5 / (dVar3 * dVar4)) * dVar10;
}

Assistant:

value_type fastAccessDx(int i) const { return left_.fastAccessDx(i) * right_.val() + right_.fastAccessDx(i) * left_.val();}